

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O2

Bool Line_Up(black_PWorker worker,Long x1,Long y1,Long x2,Long y2,Long miny,Long maxy)

{
  FT_Long FVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  long c_;
  PLong plVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  long lStack_50;
  
  c_ = y2 - y1;
  if (y1 <= maxy && (miny <= y2 && (c_ != 0 && y1 <= y2))) {
    lVar7 = x2 - x1;
    if (miny - y1 == 0 || miny < y1) {
      bVar3 = (byte)worker->precision_bits;
      iVar9 = (int)(y1 >> (bVar3 & 0x3f));
      uVar4 = (uint)y1 & worker->precision - 1U;
    }
    else {
      FVar1 = FT_MulDiv(lVar7,miny - y1,c_);
      x1 = x1 + FVar1;
      bVar3 = (byte)worker->precision_bits;
      iVar9 = (int)(miny >> (bVar3 & 0x3f));
      uVar4 = 0;
    }
    bVar11 = true;
    if (y2 <= maxy) {
      bVar11 = (worker->precision - 1U & (uint)y2) == 0;
      maxy = y2;
    }
    iVar10 = (int)(maxy >> (bVar3 & 0x3f));
    if ((int)uVar4 < 1) {
      if (worker->joint != '\0') {
        worker->top = worker->top + -1;
      }
    }
    else {
      if (iVar9 == iVar10) {
        return '\0';
      }
      FVar1 = FT_MulDiv(lVar7,(long)worker->precision - (long)(int)uVar4,c_);
      x1 = x1 + FVar1;
      iVar9 = iVar9 + 1;
    }
    worker->joint = bVar11;
    if (worker->fresh != '\0') {
      worker->cProfile->start = (long)iVar9;
      worker->fresh = '\0';
    }
    iVar10 = iVar10 - iVar9;
    if (worker->maxBuff <= worker->top + (long)iVar10 + 1) {
      worker->error = 0x62;
      return '\x01';
    }
    if (lVar7 < 1) {
      FVar1 = FT_MulDiv_No_Round((long)worker->precision,-lVar7,c_);
      FVar1 = -FVar1;
      lVar7 = (long)worker->precision * -lVar7;
      lStack_50 = -1;
    }
    else {
      FVar1 = FT_MulDiv_No_Round((long)worker->precision,lVar7,c_);
      lVar7 = worker->precision * lVar7;
      lStack_50 = 1;
    }
    lVar2 = -c_;
    plVar5 = worker->top;
    for (iVar10 = iVar10 + 1; 0 < iVar10; iVar10 = iVar10 + -1) {
      *plVar5 = x1;
      lVar2 = lVar2 + lVar7 % c_;
      lVar6 = lStack_50;
      lVar8 = c_;
      if (lVar2 < 0) {
        lVar6 = 0;
        lVar8 = 0;
      }
      lVar2 = lVar2 - lVar8;
      plVar5 = plVar5 + 1;
      x1 = x1 + FVar1 + lVar6;
    }
    worker->top = plVar5;
  }
  return '\0';
}

Assistant:

static Bool
  Line_Up( RAS_ARGS Long  x1,
                    Long  y1,
                    Long  x2,
                    Long  y2,
                    Long  miny,
                    Long  maxy )
  {
    Long   Dx, Dy;
    Int    e1, e2, f1, f2, size;     /* XXX: is `Short' sufficient? */
    Long   Ix, Rx, Ax;

    PLong  top;


    Dx = x2 - x1;
    Dy = y2 - y1;

    if ( Dy <= 0 || y2 < miny || y1 > maxy )
      return SUCCESS;

    if ( y1 < miny )
    {
      /* Take care: miny-y1 can be a very large value; we use     */
      /*            a slow MulDiv function to avoid clipping bugs */
      x1 += SMulDiv( Dx, miny - y1, Dy );
      e1  = (Int)TRUNC( miny );
      f1  = 0;
    }
    else
    {
      e1 = (Int)TRUNC( y1 );
      f1 = (Int)FRAC( y1 );
    }

    if ( y2 > maxy )
    {
      /* x2 += FMulDiv( Dx, maxy - y2, Dy );  UNNECESSARY */
      e2  = (Int)TRUNC( maxy );
      f2  = 0;
    }
    else
    {
      e2 = (Int)TRUNC( y2 );
      f2 = (Int)FRAC( y2 );
    }

    if ( f1 > 0 )
    {
      if ( e1 == e2 )
        return SUCCESS;
      else
      {
        x1 += SMulDiv( Dx, ras.precision - f1, Dy );
        e1 += 1;
      }
    }
    else
      if ( ras.joint )
      {
        ras.top--;
        ras.joint = FALSE;
      }

    ras.joint = (char)( f2 == 0 );

    if ( ras.fresh )
    {
      ras.cProfile->start = e1;
      ras.fresh           = FALSE;
    }

    size = e2 - e1 + 1;
    if ( ras.top + size >= ras.maxBuff )
    {
      ras.error = FT_THROW( Overflow );
      return FAILURE;
    }

    if ( Dx > 0 )
    {
      Ix = SMulDiv_No_Round( ras.precision, Dx, Dy );
      Rx = ( ras.precision * Dx ) % Dy;
      Dx = 1;
    }
    else
    {
      Ix = -SMulDiv_No_Round( ras.precision, -Dx, Dy );
      Rx = ( ras.precision * -Dx ) % Dy;
      Dx = -1;
    }

    Ax  = -Dy;
    top = ras.top;

    while ( size > 0 )
    {
      *top++ = x1;

      x1 += Ix;
      Ax += Rx;
      if ( Ax >= 0 )
      {
        Ax -= Dy;
        x1 += Dx;
      }
      size--;
    }

    ras.top = top;
    return SUCCESS;
  }